

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O0

bool WriteHFE(FILE *f_,shared_ptr<Disk> *disk)

{
  size_t *this;
  uint8_t uVar1;
  uint16_t x;
  unsigned_short uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uchar *__dest;
  element_type *peVar6;
  Track *track;
  uchar *__ptr;
  size_type sVar7;
  size_t sVar8;
  exception *peVar9;
  undefined4 extraout_var;
  BitBuffer *pBVar10;
  int *piVar11;
  mapped_type *this_00;
  reference pvVar12;
  pointer __ptr_00;
  int local_4e0;
  int track_len;
  int i;
  int local_4d4;
  int chunk_size;
  int track_bytes_1;
  BitBuffer *local_4c8;
  mapped_type *bitstream_1;
  uint8_t *puStack_4b8;
  uint8_t head_1;
  uint8_t *pbTrack;
  undefined1 local_4a8 [7];
  uint8_t cyl_1;
  MEMORY mem;
  int track_bytes;
  undefined1 local_3d0 [8];
  BitBuffer bitstream;
  TrackData trackdata;
  CylHead cylhead;
  uint8_t head;
  int max_track_bytes;
  unsigned_short uStack_294;
  uint8_t cyl;
  int max_disk_track_bytes;
  int data_offset;
  map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
  bitstreams;
  array<HFE_TRACK,_128UL> aTrackLUT;
  Track *track0;
  HFE_HEADER *hh;
  allocator<unsigned_char> local_32;
  value_type local_31;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> header;
  shared_ptr<Disk> *disk_local;
  FILE *f__local;
  
  local_31 = 0xff;
  header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)disk;
  std::allocator<unsigned_char>::allocator(&local_32);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,0x100,&local_31,
             &local_32);
  std::allocator<unsigned_char>::~allocator(&local_32);
  __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  CylHead::CylHead((CylHead *)(aTrackLUT._M_elems + 0x7e),0,0);
  track = Disk::read_track(peVar6,(CylHead *)(aTrackLUT._M_elems + 0x7e),false);
  strncpy((char *)__dest,"HXCPICFE",8);
  __dest[8] = '\0';
  peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar3 = Disk::cyls(peVar6);
  __dest[9] = (uchar)iVar3;
  peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  iVar3 = Disk::heads(peVar6);
  __dest[10] = (uchar)iVar3;
  uVar1 = HfeTrackEncoding(track);
  __dest[0xb] = uVar1;
  x = HfeDataRate(track);
  uVar2 = util::htole<unsigned_short>(x);
  *(unsigned_short *)(__dest + 0xc) = uVar2;
  __dest[0xe] = '\0';
  __dest[0xf] = '\0';
  uVar1 = HfeInterfaceMode(track);
  __dest[0x10] = uVar1;
  __dest[0x11] = '\x01';
  uVar2 = util::htole<unsigned_short>(1);
  *(unsigned_short *)(__dest + 0x12) = uVar2;
  __dest[0x14] = 0xff;
  __dest[0x15] = 0xff;
  __dest[0x16] = 0xff;
  __dest[0x17] = 0xff;
  __dest[0x18] = 0xff;
  __dest[0x19] = 0xff;
  __ptr = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  sVar8 = fwrite(__ptr,sVar7,1,(FILE *)f_);
  if (sVar8 == 0) {
    peVar9 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[12]>(peVar9,(char (*) [12])"write error");
    __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
  }
  iVar3 = fseek((FILE *)f_,(ulong)*(ushort *)(__dest + 0x12) << 9,0);
  if (iVar3 != 0) {
    peVar9 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[11]>(peVar9,(char (*) [11])"seek error");
    __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
  }
  memset(&bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count,0,0x200);
  std::
  map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
  ::map((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
         *)&max_disk_track_bytes);
  _uStack_294 = 2;
  max_track_bytes = 0;
  for (head = '\0'; head < __dest[9]; head = head + '\x01') {
    cylhead.head = 0;
    for (cylhead.cyl._3_1_ = 0; cylhead.cyl._3_1_ < __dest[10];
        cylhead.cyl._3_1_ = cylhead.cyl._3_1_ + 1) {
      CylHead::CylHead((CylHead *)&trackdata.field_0xb4,(uint)head,(uint)cylhead.cyl._3_1_);
      peVar6 = std::__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Disk,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          header.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
      iVar3 = (*peVar6->_vptr_Disk[4])(peVar6,&trackdata.field_0xb4,0);
      TrackData::TrackData
                ((TrackData *)&bitstream.m_wrapped,(TrackData *)CONCAT44(extraout_var,iVar3));
      TrackData::preferred((TrackData *)&stack0xfffffffffffffb78,(TrackData *)&bitstream.m_wrapped);
      pBVar10 = TrackData::bitstream((TrackData *)&stack0xfffffffffffffb78);
      BitBuffer::BitBuffer((BitBuffer *)local_3d0,pBVar10);
      TrackData::~TrackData((TrackData *)&stack0xfffffffffffffb78);
      iVar4 = BitBuffer::track_bitsize((BitBuffer *)local_3d0);
      iVar3 = iVar4 + 7;
      if (iVar4 + 7 < 0) {
        iVar3 = iVar4 + 0xe;
      }
      mem.pb._4_4_ = iVar3 >> 3;
      piVar11 = std::max<int>((int *)((long)&mem.pb + 4),&cylhead.head);
      cylhead.head = *piVar11;
      piVar11 = std::max<int>(&max_track_bytes,&cylhead.head);
      max_track_bytes = *piVar11;
      this_00 = std::
                map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                ::operator[]((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                              *)&max_disk_track_bytes,(key_type *)&trackdata.field_0xb4);
      BitBuffer::operator=(this_00,(BitBuffer *)local_3d0);
      BitBuffer::~BitBuffer((BitBuffer *)local_3d0);
      TrackData::~TrackData((TrackData *)&bitstream.m_wrapped);
    }
    uVar2 = util::htole<unsigned_short>(uStack_294);
    pvVar12 = std::array<HFE_TRACK,_128UL>::operator[]
                        ((array<HFE_TRACK,_128UL> *)
                         &bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count,(ulong)head);
    pvVar12->offset = uVar2;
    uVar2 = util::htole<unsigned_short>((short)cylhead.head * 2);
    pvVar12 = std::array<HFE_TRACK,_128UL>::operator[]
                        ((array<HFE_TRACK,_128UL> *)
                         &bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count,(ulong)head);
    pvVar12->track_len = uVar2;
    _uStack_294 = (cylhead.head << 1) / 0x200 + 1 + _uStack_294;
  }
  this = &bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count;
  __ptr_00 = std::array<HFE_TRACK,_128UL>::data((array<HFE_TRACK,_128UL> *)this);
  sVar7 = std::array<HFE_TRACK,_128UL>::size((array<HFE_TRACK,_128UL> *)this);
  sVar8 = fwrite(__ptr_00,4,sVar7,(FILE *)f_);
  sVar7 = std::array<HFE_TRACK,_128UL>::size
                    ((array<HFE_TRACK,_128UL> *)
                     &bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count);
  if (sVar8 != sVar7) {
    peVar9 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[12]>(peVar9,(char (*) [12])"write error");
    __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
  }
  MEMORY::MEMORY((MEMORY *)local_4a8,max_track_bytes * 2 + 0x200);
  pbTrack._7_1_ = 0;
  while( true ) {
    if (__dest[9] <= pbTrack._7_1_) {
      MEMORY::~MEMORY((MEMORY *)local_4a8);
      std::
      map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
      ::~map((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
              *)&max_disk_track_bytes);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      return true;
    }
    puStack_4b8 = (uint8_t *)0x0;
    for (bitstream_1._7_1_ = 0; bitstream_1._7_1_ < __dest[10];
        bitstream_1._7_1_ = bitstream_1._7_1_ + 1) {
      CylHead::CylHead((CylHead *)&chunk_size,(uint)pbTrack._7_1_,(uint)bitstream_1._7_1_);
      local_4c8 = std::
                  map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                  ::operator[]((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                                *)&max_disk_track_bytes,(key_type *)&chunk_size);
      iVar3 = BitBuffer::track_bitsize(local_4c8);
      local_4d4 = iVar3 + 7;
      if (iVar3 + 7 < 0) {
        local_4d4 = iVar3 + 0xe;
      }
      local_4d4 = local_4d4 >> 3;
      BitBuffer::seek(local_4c8,0);
      puStack_4b8 = (uint8_t *)(mem._8_8_ + (long)(int)((uint)bitstream_1._7_1_ << 8));
      for (; 0 < local_4d4; local_4d4 = local_4d4 - i) {
        track_len = 0x100;
        piVar11 = std::min<int>(&local_4d4,&track_len);
        i = *piVar11;
        for (local_4e0 = 0; local_4e0 < i; local_4e0 = local_4e0 + 1) {
          uVar1 = BitBuffer::read8_lsb(local_4c8);
          *puStack_4b8 = uVar1;
          puStack_4b8 = puStack_4b8 + 1;
        }
        memset(puStack_4b8,0x55,(long)(0x100 - i));
        puStack_4b8 = puStack_4b8 + (0x200 - i);
      }
    }
    pvVar12 = std::array<HFE_TRACK,_128UL>::operator[]
                        ((array<HFE_TRACK,_128UL> *)
                         &bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ulong)pbTrack._7_1_);
    uVar2 = util::letoh<unsigned_short>(pvVar12->offset);
    fseek((FILE *)f_,(ulong)uVar2 << 9,0);
    pvVar12 = std::array<HFE_TRACK,_128UL>::operator[]
                        ((array<HFE_TRACK,_128UL> *)
                         &bitstreams._M_t._M_impl.super__Rb_tree_header._M_node_count,
                         (ulong)pbTrack._7_1_);
    uVar2 = util::letoh<unsigned_short>(pvVar12->track_len);
    uVar5 = uVar2 + 0x1ff & 0x1fe00;
    sVar8 = fwrite((void *)mem._8_8_,1,(long)(int)uVar5,(FILE *)f_);
    if (sVar8 != (long)(int)uVar5) break;
    pbTrack._7_1_ = pbTrack._7_1_ + 1;
  }
  peVar9 = (exception *)__cxa_allocate_exception(0x10);
  util::exception::exception<char_const(&)[12]>(peVar9,(char (*) [12])"write error");
  __cxa_throw(peVar9,&util::exception::typeinfo,util::exception::~exception);
}

Assistant:

bool WriteHFE(FILE* f_, std::shared_ptr<Disk>& disk)
{
    std::vector<uint8_t> header(256, 0xff);
    auto& hh = *reinterpret_cast<HFE_HEADER*>(header.data());

    auto& track0 = disk->read_track({ 0, 0 });

    strncpy(hh.header_signature, HFE_SIGNATURE, sizeof(hh.header_signature));
    hh.format_revision = 0x00;
    hh.number_of_tracks = static_cast<uint8_t>(disk->cyls());
    hh.number_of_sides = static_cast<uint8_t>(disk->heads());
    hh.track_encoding = HfeTrackEncoding(track0);
    hh.bitrate_kbps = util::htole(HfeDataRate(track0));
    hh.floppy_rpm = 0;
    hh.floppy_interface_mode = HfeInterfaceMode(track0);
    hh.do_not_use = 0x01;
    hh.track_list_offset = util::htole(static_cast<uint16_t>(0x200 >> 9));
    hh.write_allowed = 0xff;
    hh.single_step = 0xff;
    hh.track0s0_altencoding = 0xff;
    hh.track0s0_encoding = 0xff;
    hh.track0s1_altencoding = 0xff;
    hh.track0s1_encoding = 0xff;

    if (!fwrite(header.data(), header.size(), 1, f_))
        throw util::exception("write error");
    if (fseek(f_, hh.track_list_offset << 9, SEEK_SET))
        throw util::exception("seek error");

    std::array<HFE_TRACK, MAX_TRACKS> aTrackLUT{};
    std::map<CylHead, BitBuffer> bitstreams;
    int data_offset = 2;

    auto max_disk_track_bytes = 0;
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        auto max_track_bytes = 0;
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto trackdata = disk->read(cylhead);
            auto bitstream = trackdata.preferred().bitstream();
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            max_track_bytes = std::max(track_bytes, max_track_bytes);
            max_disk_track_bytes = std::max(max_disk_track_bytes, max_track_bytes);
            bitstreams[cylhead] = std::move(bitstream);
        }

        aTrackLUT[cyl].offset = util::htole(static_cast<uint16_t>(data_offset));
        aTrackLUT[cyl].track_len = util::htole(static_cast<uint16_t>(max_track_bytes * 2));

        data_offset += ((max_track_bytes * 2) / 512) + 1;
    }

    if (fwrite(aTrackLUT.data(), sizeof(aTrackLUT[0]), aTrackLUT.size(), f_) != aTrackLUT.size())
        throw util::exception("write error");

    MEMORY mem(max_disk_track_bytes * 2 + 512);
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        uint8_t* pbTrack{};
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            auto& bitstream = bitstreams[{ cyl, head }];
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            bitstream.seek(0);

            pbTrack = mem.pb + head * 256;
            while (track_bytes > 0)
            {
                auto chunk_size = std::min(track_bytes, 0x100);
                for (int i = 0; i < chunk_size; ++i)
                    *pbTrack++ = bitstream.read8_lsb();
                memset(pbTrack, 0x55, 0x100 - chunk_size);
                pbTrack += 0x200 - chunk_size;
                track_bytes -= chunk_size;
            }
        }

        fseek(f_, util::letoh(aTrackLUT[cyl].offset) * 512, SEEK_SET);
        auto track_len = (util::letoh(aTrackLUT[cyl].track_len) + 511) & ~0x1ff;
        if (fwrite(mem.pb, 1, track_len, f_) != static_cast<size_t>(track_len))
            throw util::exception("write error");
    }

    return true;
}